

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddRow
          (SPxLPBase<double> *this,double *lhsValue,SVectorBase<double> *rowVec,double *rhsValue,
          bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  SVectorBase<double> *this_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  byte in_R8B;
  Real RVar7;
  int k;
  LPColBase<double> empty;
  double val;
  int i;
  int j;
  SVectorBase<double> *vec;
  DataArray<int> *colscaleExp;
  int newRowScaleExp;
  int oldColNumber;
  int idx;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  LPColBase<double> *in_stack_ffffffffffffff08;
  LPColSetBase<double> *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  double *in_stack_ffffffffffffff28;
  LPRowSetBase<double> *in_stack_ffffffffffffff30;
  double dVar8;
  int local_9c;
  uint local_54;
  int local_30;
  
  iVar1 = nRows((SPxLPBase<double> *)0x234655);
  iVar2 = nCols((SPxLPBase<double> *)0x234666);
  local_30 = 0;
  LPRowSetBase<double>::add
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (SVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(double *)in_stack_ffffffffffffff10,
             (int *)in_stack_ffffffffffffff08);
  if ((in_R8B & 1) != 0) {
    local_30 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                         ((long *)in_RDI[0x35],in_RDX,(DataArray<int> *)(in_RDI + 0x2f));
    pdVar4 = rhs((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
    dVar8 = *pdVar4;
    pdVar4 = (double *)infinity();
    if (dVar8 < *pdVar4) {
      rhs_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
            in_stack_fffffffffffffefc);
      RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      pdVar4 = rhs_w((SPxLPBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
      *pdVar4 = RVar7;
    }
    pdVar4 = lhs((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
    dVar8 = *pdVar4;
    pdVar4 = (double *)infinity();
    if (-*pdVar4 < dVar8) {
      lhs_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
            in_stack_fffffffffffffefc);
      RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      pdVar4 = lhs_w((SPxLPBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
      *pdVar4 = RVar7;
    }
    maxRowObj_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffefc);
    RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
    pdVar4 = maxRowObj_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffefc);
    *pdVar4 = RVar7;
    iVar3 = local_30;
    piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),iVar1);
    *piVar5 = iVar3;
  }
  this_00 = rowVector_w((SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
  local_54 = SVectorBase<double>::size(this_00);
  uVar6 = extraout_RDX;
  while (local_54 = local_54 - 1, -1 < (int)local_54) {
    piVar5 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_54,(int)uVar6);
    iVar1 = *piVar5;
    if ((in_R8B & 1) != 0) {
      pdVar4 = SVectorBase<double>::value(this_00,local_54);
      in_stack_ffffffffffffff08 = (LPColBase<double> *)*pdVar4;
      in_stack_ffffffffffffff04 = local_30;
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),iVar1);
      in_stack_ffffffffffffff10 =
           (LPColSetBase<double> *)
           spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffefc);
      pdVar4 = SVectorBase<double>::value(this_00,local_54);
      *pdVar4 = (double)in_stack_ffffffffffffff10;
    }
    SVectorBase<double>::value(this_00,local_54);
    in_stack_ffffffffffffff00 = iVar1;
    iVar3 = nCols((SPxLPBase<double> *)0x234984);
    if (iVar3 <= in_stack_ffffffffffffff00) {
      LPColBase<double>::LPColBase
                ((LPColBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
      in_stack_fffffffffffffefc = nCols((SPxLPBase<double> *)0x2349a4);
      for (local_9c = in_stack_fffffffffffffefc; local_9c <= iVar1; local_9c = local_9c + 1) {
        LPColSetBase<double>::add(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      LPColBase<double>::~LPColBase((LPColBase<double> *)0x234a0d);
    }
    LPColSetBase<double>::add2
              (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (int)in_stack_ffffffffffffff08,
               (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    uVar6 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x280))(in_RDI,1);
  iVar1 = nCols((SPxLPBase<double> *)0x234a6d);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar1 - iVar2);
  return;
}

Assistant:

void doAddRow(const R& lhsValue, const SVectorBase<R>& rowVec, const R& rhsValue,
                 bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(lhsValue, rowVec, rhsValue);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(rowVec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      SVectorBase<R>& vec = rowVector_w(idx);

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }